

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3HashInit(Fts3Hash *pNew,char keyClass,char copyKey)

{
  char copyKey_local;
  char keyClass_local;
  Fts3Hash *pNew_local;
  
  pNew->keyClass = keyClass;
  pNew->copyKey = copyKey;
  pNew->first = (Fts3HashElem *)0x0;
  pNew->count = 0;
  pNew->htsize = 0;
  pNew->ht = (_fts3ht *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3HashInit(Fts3Hash *pNew, char keyClass, char copyKey){
  assert( pNew!=0 );
  assert( keyClass>=FTS3_HASH_STRING && keyClass<=FTS3_HASH_BINARY );
  pNew->keyClass = keyClass;
  pNew->copyKey = copyKey;
  pNew->first = 0;
  pNew->count = 0;
  pNew->htsize = 0;
  pNew->ht = 0;
}